

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * jx9_context_alloc_chunk(jx9_context *pCtx,uint nByte,int ZeroChunk,int AutoRelease)

{
  void *pSrc;
  jx9_aux_data sAux;
  void *local_30;
  
  pSrc = SyMemBackendAlloc(&pCtx->pVm->sAllocator,nByte);
  if (pSrc != (void *)0x0) {
    if (ZeroChunk != 0) {
      SyZero(pSrc,nByte);
    }
    if (AutoRelease != 0) {
      local_30 = pSrc;
      SySetPut(&pCtx->sChunk,&local_30);
    }
  }
  return pSrc;
}

Assistant:

JX9_PRIVATE void * jx9_context_alloc_chunk(jx9_context *pCtx, unsigned int nByte, int ZeroChunk, int AutoRelease)
{
	void *pChunk;
	pChunk = SyMemBackendAlloc(&pCtx->pVm->sAllocator, nByte);
	if( pChunk ){
		if( ZeroChunk ){
			/* Zero the memory chunk */
			SyZero(pChunk, nByte);
		}
		if( AutoRelease ){
			jx9_aux_data sAux;
			/* Track the chunk so that it can be released automatically 
			 * upon this context is destroyed.
			 */
			sAux.pAuxData = pChunk;
			SySetPut(&pCtx->sChunk, (const void *)&sAux);
		}
	}
	return pChunk;
}